

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::hash
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint64_t seed)

{
  byte bVar1;
  ValueLength VVar2;
  long in_RSI;
  size_t in_RDI;
  uint64_t h;
  size_t size;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_ffffffffffffffd0;
  uint64_t local_10;
  
  VVar2 = byteSize(in_stack_ffffffffffffffd0);
  if ((VVar2 == 1) && (in_RSI == 0xdeadbeef)) {
    bVar1 = head((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11ccb8);
    local_10 = SliceStaticData::PrecalculatedHashesForDefaultSeed[bVar1];
  }
  else {
    start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x11cce2);
    local_10 = VELOCYPACK_XXH64(in_stack_ffffffffffffffd0,in_RDI,0x11ccf4);
  }
  return local_10;
}

Assistant:

inline uint64_t hash(uint64_t seed = defaultSeed64) const {
    std::size_t const size = checkOverflow(byteSize());
    if (size == 1 && seed == defaultSeed64) {
      uint64_t h = SliceStaticData::PrecalculatedHashesForDefaultSeed[head()];
      VELOCYPACK_ASSERT(h != 0);
      return h;
    }
    return VELOCYPACK_HASH(start(), size, seed);
  }